

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

string * __thiscall
FIX::UtcTimeStampConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeStampConvertor *this,UtcTimeStamp *value,
          int precision)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ulong uVar4;
  undefined1 *puVar5;
  uint uVar6;
  undefined1 *puVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  char result [27];
  int day;
  int month;
  int year;
  undefined8 uStack_70;
  byte local_68 [2];
  undefined2 local_66;
  undefined1 local_64 [2];
  undefined1 local_62 [2];
  undefined1 local_60;
  undefined1 local_5f [2];
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56 [10];
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  string *local_38;
  
  uVar6 = (uint)value;
  uVar10 = 9;
  if (uVar6 < 9) {
    uVar10 = uVar6;
  }
  uVar14 = 0;
  if (-1 < (int)uVar6) {
    uVar14 = (ulong)uVar10;
  }
  uStack_70 = 0x1339b5;
  local_38 = __return_storage_ptr__;
  DateTime::getYMD(*(int *)(this + 8),(int *)&local_44,(int *)&local_48,(int *)&local_4c);
  uVar9 = *(ulong *)(this + 0x10);
  iVar2 = (int)((long)uVar9 / 1000000000);
  iVar13 = (int)uVar14;
  switch(uVar14) {
  case 0:
    break;
  case 1:
    uVar14 = (uVar9 % 1000000000) / 100000000;
    break;
  case 2:
    uVar14 = (uVar9 % 1000000000) / 10000000;
    break;
  case 3:
    uVar14 = (uVar9 % 1000000000) / 1000000;
    break;
  case 4:
    uVar14 = (uVar9 % 1000000000) / 100000;
    break;
  case 5:
    uVar14 = (uVar9 % 1000000000) / 10000;
    break;
  case 6:
    uVar14 = (uVar9 % 1000000000) / 1000;
    break;
  case 7:
    uVar14 = (uVar9 % 1000000000) * 0x28f5c29;
    goto LAB_00133b77;
  case 8:
    uVar14 = (uVar9 % 1000000000) * 0x1999999a;
LAB_00133b77:
    uVar14 = uVar14 >> 0x20;
    break;
  default:
    uVar14 = (ulong)(uint)((int)uVar9 + (int)(uVar9 / 1000000000) * -1000000000);
  }
  uVar10 = -local_44;
  if (0 < (int)local_44) {
    uVar10 = local_44;
  }
  puVar5 = local_64;
  uVar6 = uVar10;
  if (99 < uVar10) {
    do {
      uVar6 = uVar10 / 100;
      *(undefined2 *)(puVar5 + -2) = *(undefined2 *)(digit_pairs + (ulong)(uVar10 % 100) * 2);
      puVar5 = puVar5 + -2;
      bVar1 = 9999 < uVar10;
      uVar10 = uVar10 / 100;
    } while (bVar1);
  }
  local_40 = uVar14;
  if (uVar6 < 10) {
    bVar11 = (byte)uVar6 | 0x30;
    lVar12 = -1;
  }
  else {
    puVar5[-1] = digit_pairs[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar6 * 2];
    lVar12 = -2;
  }
  puVar7 = puVar5 + lVar12;
  puVar5[lVar12] = bVar11;
  if ((int)local_44 < 0) {
    puVar7[-1] = 0x2d;
    puVar7 = puVar7 + -1;
  }
  if (local_68 <= puVar7 && (long)puVar7 - (long)local_68 != 0) {
    uStack_70 = 0x133c5d;
    memset(local_68,0x30,(long)puVar7 - (long)local_68);
  }
  uVar10 = -local_48;
  if (0 < (int)local_48) {
    uVar10 = local_48;
  }
  lVar12 = 6;
  uVar6 = uVar10;
  if (99 < uVar10) {
    do {
      uVar10 = uVar6 / 100;
      *(undefined2 *)(local_68 + lVar12 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar6 % 100) * 2);
      lVar12 = lVar12 + -2;
      bVar1 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar1);
  }
  if (uVar10 < 10) {
    bVar11 = (byte)uVar10 | 0x30;
    lVar8 = -1;
  }
  else {
    local_68[lVar12 + -1] = digit_pairs[((ulong)uVar10 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar10 * 2];
    lVar8 = -2;
  }
  lVar8 = lVar8 + lVar12;
  local_68[lVar8] = bVar11;
  if ((int)local_48 < 0) {
    local_68[lVar8 + -1] = 0x2d;
    lVar8 = lVar8 + -1;
  }
  if (4 < lVar8) {
    uStack_70 = 0x133d20;
    memset(local_64,0x30,lVar8 - 4);
  }
  uVar10 = -local_4c;
  if (0 < (int)local_4c) {
    uVar10 = local_4c;
  }
  lVar12 = 8;
  uVar6 = uVar10;
  if (99 < uVar10) {
    do {
      uVar10 = uVar6 / 100;
      *(undefined2 *)(local_68 + lVar12 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar6 % 100) * 2);
      lVar12 = lVar12 + -2;
      bVar1 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar1);
  }
  if (uVar10 < 10) {
    bVar11 = (byte)uVar10 | 0x30;
    lVar8 = -1;
  }
  else {
    local_68[lVar12 + -1] = digit_pairs[((ulong)uVar10 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar10 * 2];
    lVar8 = -2;
  }
  uVar10 = iVar2 / 0xe10;
  lVar8 = lVar8 + lVar12;
  local_68[lVar8] = bVar11;
  if ((int)local_4c < 0) {
    local_68[lVar8 + -1] = 0x2d;
    lVar8 = lVar8 + -1;
  }
  if (6 < lVar8) {
    uStack_70 = 0x133de2;
    memset(local_62,0x30,lVar8 - 6);
  }
  local_60 = 0x2d;
  uVar6 = -uVar10;
  if (0 < (int)uVar10) {
    uVar6 = uVar10;
  }
  lVar12 = 0xb;
  uVar10 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar10 / 100;
      *(undefined2 *)(local_68 + lVar12 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar10 % 100) * 2);
      lVar12 = lVar12 + -2;
      bVar1 = 9999 < uVar10;
      uVar10 = uVar10 / 100;
    } while (bVar1);
  }
  if (uVar6 < 10) {
    bVar11 = (byte)uVar6 | 0x30;
    lVar8 = -1;
  }
  else {
    local_68[lVar12 + -1] = digit_pairs[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar6 * 2];
    lVar8 = -2;
  }
  lVar8 = lVar8 + lVar12;
  local_68[lVar8] = bVar11;
  if (iVar2 < -0xe0f) {
    local_68[lVar8 + -1] = 0x2d;
    lVar8 = lVar8 + -1;
  }
  uVar10 = (iVar2 / 0x3c) % 0x3c;
  if (9 < lVar8) {
    uStack_70 = 0x133e9b;
    memset(local_5f,0x30,lVar8 - 9);
  }
  local_5d = 0x3a;
  uVar6 = -uVar10;
  if (0 < (int)uVar10) {
    uVar6 = uVar10;
  }
  if (9 < uVar6) {
    local_5b = digit_pairs[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar6 * 2];
    lVar12 = 0xc;
  }
  else {
    bVar11 = (byte)uVar6 | 0x30;
    lVar12 = 0xd;
  }
  uVar15 = iVar2 % 0x3c;
  local_68[lVar12] = bVar11;
  if ((int)uVar10 < 0) {
    local_68[lVar12 + -1] = 0x2d;
  }
  else if (uVar6 < 10) {
    uStack_70 = 0x133eff;
    memset(&local_5c,0x30,(ulong)(9 >= uVar6));
  }
  local_5a = 0x3a;
  uVar10 = -uVar15;
  if (0 < (int)uVar15) {
    uVar10 = uVar15;
  }
  if (9 < uVar10) {
    local_58 = digit_pairs[((ulong)uVar10 * 2 & 0xffffffff) + 1];
    bVar11 = digit_pairs[(ulong)uVar10 * 2];
    lVar12 = 0xf;
  }
  else {
    bVar11 = (byte)uVar10 | 0x30;
    lVar12 = 0x10;
  }
  local_68[lVar12] = bVar11;
  if ((int)uVar15 < 0) {
    local_68[lVar12 + -1] = 0x2d;
  }
  else if (uVar10 < 10) {
    uStack_70 = 0x133f64;
    memset(&local_59,0x30,(ulong)(9 >= uVar10));
  }
  if (iVar13 == 0) {
    uVar14 = 0x11;
  }
  else {
    local_57 = 0x2e;
    uVar14 = (ulong)(iVar13 + 0x12);
    uVar9 = (ulong)(uint)-(int)local_40;
    if (0 < (int)local_40) {
      uVar9 = local_40 & 0xffffffff;
    }
    uVar10 = (uint)uVar9;
    uVar4 = uVar14;
    if (99 < uVar10) {
      do {
        uVar6 = (uint)uVar9;
        uVar10 = (uint)(uVar9 / 100);
        uVar9 = uVar9 / 100;
        *(undefined2 *)(local_68 + (uVar4 - 2)) =
             *(undefined2 *)(digit_pairs + (ulong)(uVar6 + (int)uVar9 * -100) * 2);
        uVar4 = uVar4 - 2;
      } while (9999 < uVar6);
    }
    if (uVar10 < 10) {
      bVar11 = (byte)uVar10 | 0x30;
      lVar12 = -1;
    }
    else {
      local_68[uVar4 - 1] = digit_pairs[((ulong)uVar10 * 2 & 0xffffffff) + 1];
      bVar11 = digit_pairs[(ulong)uVar10 * 2];
      lVar12 = -2;
    }
    lVar12 = lVar12 + uVar4;
    local_68[lVar12] = bVar11;
    if (0x12 < lVar12) {
      uStack_70 = 0x134013;
      memset(local_56,0x30,lVar12 - 0x12);
    }
  }
  psVar3 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  uStack_70 = 0x134031;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,local_68,local_68 + uVar14);
  return psVar3;
}

Assistant:

EXCEPT(FieldConvertError) {
    char result[17 + 10]; // Maximum
    int year, month, day, hour, minute, second, fraction;

    precision = clamp_of(precision, 0, 9);

    value.getYMD(year, month, day);
    value.getHMS(hour, minute, second, fraction, precision);

    integer_to_string_padded(result, 4, year);
    integer_to_string_padded(result + 4, 2, month);
    integer_to_string_padded(result + 6, 2, day);
    result[8] = '-';
    integer_to_string_padded(result + 9, 2, hour);
    result[11] = ':';
    integer_to_string_padded(result + 12, 2, minute);
    result[14] = ':';
    integer_to_string_padded(result + 15, 2, second);

    if (precision) {
      result[17] = '.';
      integer_to_string_padded(result + 18, precision, fraction);
    }

    return std::string(result, precision ? (17 + 1 + precision) : 17);
  }